

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Opnd * __thiscall
GlobOpt::CopyPropReplaceOpnd
          (GlobOpt *this,Instr *instr,Opnd *opnd,StackSym *copySym,IndirOpnd *parentIndirOpnd)

{
  OpCode OVar1;
  Func *func;
  Opnd *pOVar2;
  code *pcVar3;
  anon_class_24_3_cd72d7c2 fn;
  bool bVar4;
  OpndKind OVar5;
  uint sourceContextId;
  uint functionId;
  uint uVar6;
  undefined4 *puVar7;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  PropertySymOpnd *opnd_00;
  PropertySymOpnd *opnd_01;
  Instr *pIVar8;
  PropertySymOpnd *pPVar9;
  ulong uVar10;
  RegOpnd *pRVar11;
  StackSym *pSVar12;
  StackSym *pSVar13;
  byte bVar14;
  StackSym *local_48;
  StackSym *copySym_local;
  Instr *local_38;
  Instr *checkObjTypeInstr;
  
  local_48 = copySym;
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    if (((instr->m_src1 != opnd) && (instr->m_src2 != opnd)) &&
       ((instr->m_dst != opnd || (OVar5 = IR::Opnd::GetKind(opnd), OVar5 != OpndKindIndir))))
    goto LAB_00457b48;
  }
  else if ((parentIndirOpnd->m_baseOpnd != (RegOpnd *)opnd) &&
          (parentIndirOpnd->m_indexOpnd != (RegOpnd *)opnd)) {
LAB_00457b48:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xfa6,
                       "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                       ,
                       "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                      );
    if (!bVar4) goto LAB_00458471;
    *puVar7 = 0;
  }
  bVar4 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,&local_48->super_Sym);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xfa7,"(CurrentBlockData()->IsLive(copySym))",
                       "CurrentBlockData()->IsLive(copySym)");
    if (!bVar4) goto LAB_00458471;
    *puVar7 = 0;
  }
  copySym_local = local_48;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,sourceContextId,functionId);
  if (bVar4) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    IR::Opnd::Dump(opnd);
    Output::Print(L" : ");
    Output::Print(L"Copy prop s%d\n",(ulong)(copySym_local->super_Sym).m_id);
    Output::Flush();
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,FieldCopyPropPhase);
  if (bVar4) {
    IR::Instr::DumpFieldCopyPropTestTrace(instr,SUB41((*(uint *)&this->field_0xf4 & 0x20) >> 5,0));
  }
  CaptureByteCodeSymUses(this,instr);
  OVar5 = IR::Opnd::GetKind(opnd);
  if (OVar5 == OpndKindReg) {
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_00458471;
      *puVar7 = 0;
    }
    opnd[1]._vptr_Opnd = (_func_int **)copySym_local;
    IR::Opnd::SetIsJITOptimizedReg(opnd,true);
    opnd->field_0xb = opnd->field_0xb & 0xfb;
    if (parentIndirOpnd != (IndirOpnd *)0x0) {
      return opnd;
    }
  }
  else {
    if ((this->currentBlock->loop != (Loop *)0x0) &&
       (OVar5 = IR::Opnd::GetKind(opnd), OVar5 == OpndKindSym)) {
      OVar5 = IR::Opnd::GetKind(opnd);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_00458471;
        *puVar7 = 0;
      }
      bVar4 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)opnd);
      if (bVar4) {
        opnd_00 = IR::Opnd::AsPropertySymOpnd(opnd);
        bVar4 = CheckIfPropOpEmitsTypeCheck(this,instr,opnd_00);
        if (bVar4) {
          if (opnd_00->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xfd1,"(propertySymOpnd->GetGuardedPropOps() == nullptr)",
                               "propertySymOpnd->GetGuardedPropOps() == nullptr");
            if (!bVar4) goto LAB_00458471;
            *puVar7 = 0;
          }
          opnd_01 = CreateOpndForTypeCheckOnly(this,opnd_00,instr->m_func);
          pIVar8 = IR::Instr::New(CheckObjType,instr->m_func);
          local_38 = pIVar8;
          if (pIVar8->m_src1 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar4) goto LAB_00458471;
            *puVar7 = 0;
          }
          func = pIVar8->m_func;
          if ((opnd_01->super_SymOpnd).super_Opnd.isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar4) goto LAB_00458471;
            *puVar7 = 0;
          }
          bVar14 = (opnd_01->super_SymOpnd).super_Opnd.field_0xb;
          pPVar9 = opnd_01;
          if ((bVar14 & 2) != 0) {
            pPVar9 = (PropertySymOpnd *)IR::Opnd::Copy((Opnd *)opnd_01,func);
            bVar14 = (pPVar9->super_SymOpnd).super_Opnd.field_0xb;
          }
          (pPVar9->super_SymOpnd).super_Opnd.field_0xb = bVar14 | 2;
          pIVar8->m_src1 = (Opnd *)pPVar9;
          IR::Instr::SetByteCodeOffset(local_38,instr);
          IR::Instr::InsertBefore(instr,local_38);
          FinishOptPropOp(this,local_38,opnd_01,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
          if (((opnd_00->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xfdf,"(!propertySymOpnd->IsTypeChecked())",
                               "!propertySymOpnd->IsTypeChecked()");
            if (!bVar4) goto LAB_00458471;
            *puVar7 = 0;
          }
          local_38 = SetTypeCheckBailOut(this,(Opnd *)opnd_01,local_38,(BailOutInfo *)0x0);
          if ((local_38->field_0x38 & 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xfe1,"(checkObjTypeInstr->HasBailOutInfo())",
                               "checkObjTypeInstr->HasBailOutInfo()");
            if (!bVar4) goto LAB_00458471;
            *puVar7 = 0;
          }
          if ((this->currentBlock->loop != (Loop *)0x0) && (this->prePassLoop == (Loop *)0x0)) {
            fn.checkObjTypeInstr = &local_38;
            fn.this = this;
            fn.copySym = &local_48;
            TrackByteCodeUsesForInstrAddedInOptInstr<GlobOpt::CopyPropReplaceOpnd(IR::Instr*,IR::Opnd*,StackSym*,IR::IndirOpnd*)::__0>
                      (this,local_38,fn);
          }
        }
      }
    }
    OVar5 = IR::Opnd::GetKind(opnd);
    if ((OVar5 == OpndKindSym) && ((opnd->field_0xb & 4) != 0)) {
      OVar5 = IR::Opnd::GetKind(opnd);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_00458471;
        *puVar7 = 0;
      }
      EndFieldLifetime(this,(SymOpnd *)opnd);
    }
    pRVar11 = IR::RegOpnd::New(copySym_local,opnd->m_type,instr->m_func);
    IR::Opnd::SetIsJITOptimizedReg(&pRVar11->super_Opnd,true);
    IR::Instr::ReplaceSrc(instr,opnd,&pRVar11->super_Opnd);
    opnd = &pRVar11->super_Opnd;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 < 0x6c) {
    uVar6 = OVar1 - 0x2b;
    uVar10 = (ulong)uVar6;
    if (0x3f < uVar6) goto LAB_00458237;
    if ((0xa808000000000000U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_00458230;
    if (uVar10 == 0) {
      instr->m_opcode = Typeof;
      goto LAB_00458237;
    }
    if (((uVar10 != 0x1a) || (OVar5 = IR::Opnd::GetKind(instr->m_dst), OVar5 != OpndKindReg)) ||
       (OVar5 = IR::Opnd::GetKind(instr->m_src1), OVar5 != OpndKindReg)) goto LAB_00458237;
    pRVar11 = IR::Opnd::AsRegOpnd(instr->m_dst);
    pSVar12 = IR::Opnd::GetStackSym(&pRVar11->super_Opnd);
    pRVar11 = IR::Opnd::AsRegOpnd(instr->m_src1);
    pSVar13 = IR::Opnd::GetStackSym(&pRVar11->super_Opnd);
    if (pSVar12 != pSVar13) goto LAB_00458237;
LAB_00458435:
    InsertByteCodeUses(this,instr,true);
    instr->m_opcode = Nop;
  }
  else {
    uVar6 = (uint)OVar1;
    if (OVar1 < LdRootFldForTypeOf) {
      uVar6 = uVar6 - 0x6c;
      if (0x20 < uVar6) goto LAB_00458237;
      if ((0x3000005UL >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
        if ((ulong)uVar6 != 0x20) goto LAB_00458237;
        goto LAB_00458327;
      }
    }
    else if (OVar1 < LdMethodFromFlags) {
      if ((uVar6 != 0x123) && (uVar6 != 0x131)) goto LAB_00458237;
    }
    else {
      if (uVar6 == 0x1f5) {
        instr->m_opcode = Ld_A;
        IR::Instr::ClearBailOutInfo(instr);
        goto LAB_00458237;
      }
      if (uVar6 != 0x1f6) {
        if ((uVar6 == 0x1f8) && (OVar5 = IR::Opnd::GetKind(instr->m_src2), OVar5 == OpndKindReg)) {
          instr->m_opcode = StSlot;
          IR::Instr::FreeSrc2(instr);
          return (Opnd *)0x0;
        }
        goto LAB_00458237;
      }
LAB_00458327:
      OVar5 = IR::Opnd::GetKind(instr->m_dst);
      if ((OVar5 == OpndKindReg) && (OVar5 = IR::Opnd::GetKind(instr->m_src1), OVar5 == OpndKindReg)
         ) {
        pOVar2 = instr->m_dst;
        OVar5 = IR::Opnd::GetKind(pOVar2);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_00458471;
          *puVar7 = 0;
        }
        pSVar12 = IR::Opnd::GetStackSym(pOVar2);
        pOVar2 = instr->m_src1;
        OVar5 = IR::Opnd::GetKind(pOVar2);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          copySym_local = pSVar12;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) {
LAB_00458471:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
          pSVar12 = copySym_local;
        }
        pSVar13 = IR::Opnd::GetStackSym(pOVar2);
        if (pSVar12 == pSVar13) goto LAB_00458435;
      }
    }
LAB_00458230:
    instr->m_opcode = Ld_A;
  }
LAB_00458237:
  GlobOptBlockData::MarkTempLastUse(&this->currentBlock->globOptData,instr,(RegOpnd *)opnd);
  return &((RegOpnd *)opnd)->super_Opnd;
}

Assistant:

IR::Opnd *
GlobOpt::CopyPropReplaceOpnd(IR::Instr * instr, IR::Opnd * opnd, StackSym * copySym, IR::IndirOpnd *parentIndirOpnd)
{
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());
    Assert(CurrentBlockData()->IsLive(copySym));

    IR::RegOpnd *regOpnd;
    StackSym *newSym = copySym;

    GOPT_TRACE_OPND(opnd, _u("Copy prop s%d\n"), newSym->m_id);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    //Need to update DumpFieldCopyPropTestTrace for every new opcode that is added for fieldcopyprop
    if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FieldCopyPropPhase))
    {
        instr->DumpFieldCopyPropTestTrace(this->isRecursiveCallOnLandingPad);
    }
#endif

    this->CaptureByteCodeSymUses(instr);
    if (opnd->IsRegOpnd())
    {
        regOpnd = opnd->AsRegOpnd();
        regOpnd->m_sym = newSym;
        regOpnd->SetIsJITOptimizedReg(true);

        // The dead bit on the opnd is specific to the sym it is referencing. Since we replaced the sym, the bit is reset.
        regOpnd->SetIsDead(false);

        if(parentIndirOpnd)
        {
            return regOpnd;
        }
    }
    else
    {
        // If this is an object type specialized field load inside a loop, and it produces a type value which wasn't live
        // before, make sure the type check is left in the loop, because it may be the last type check in the loop protecting
        // other fields which are not hoistable and are lexically upstream in the loop.  If the check is not ultimately
        // needed, the dead store pass will remove it.
        if (this->currentBlock->loop != nullptr && opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            IR::PropertySymOpnd* propertySymOpnd = opnd->AsPropertySymOpnd();
            if (CheckIfPropOpEmitsTypeCheck(instr, propertySymOpnd))
            {
                // We only set guarded properties in the dead store pass, so they shouldn't be set here yet. If they were
                // we would need to move them from this operand to the operand which is being copy propagated.
                Assert(propertySymOpnd->GetGuardedPropOps() == nullptr);

                // We're creating a copy of this operand to be reused in the same spot in the flow, so we can copy all
                // flow sensitive fields.  However, we will do only a type check here (no property access) and only for
                // the sake of downstream instructions, so the flags pertaining to this property access are irrelevant.
                IR::PropertySymOpnd* checkObjTypeOpnd = CreateOpndForTypeCheckOnly(propertySymOpnd, instr->m_func);
                IR::Instr* checkObjTypeInstr = IR::Instr::New(Js::OpCode::CheckObjType, instr->m_func);
                checkObjTypeInstr->SetSrc1(checkObjTypeOpnd);
                checkObjTypeInstr->SetByteCodeOffset(instr);
                instr->InsertBefore(checkObjTypeInstr);

                // Since we inserted this instruction before the one that is being processed in natural flow, we must process
                // it for object type spec explicitly here.
                FinishOptPropOp(checkObjTypeInstr, checkObjTypeOpnd);
                Assert(!propertySymOpnd->IsTypeChecked());
                checkObjTypeInstr = this->SetTypeCheckBailOut(checkObjTypeOpnd, checkObjTypeInstr, nullptr);
                Assert(checkObjTypeInstr->HasBailOutInfo());

                if (this->currentBlock->loop && !this->IsLoopPrePass())
                {
                    // Try hoisting this checkObjType.
                    // But since this isn't the current instr being optimized, we need to play tricks with
                    // the byteCodeUse fields...
                    TrackByteCodeUsesForInstrAddedInOptInstr(checkObjTypeInstr, [&]()
                    {
                        TryHoistInvariant(checkObjTypeInstr, this->currentBlock, NULL, CurrentBlockData()->FindValue(copySym), NULL, true);
                    });
                }
            }
        }

        if (opnd->IsSymOpnd() && opnd->GetIsDead())
        {
            // Take the property sym out of the live fields set
            this->EndFieldLifetime(opnd->AsSymOpnd());
        }
        regOpnd = IR::RegOpnd::New(newSym, opnd->GetType(), instr->m_func);
        regOpnd->SetIsJITOptimizedReg(true);
        instr->ReplaceSrc(opnd, regOpnd);
    }

    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
        if (instr->GetDst()->IsRegOpnd() && instr->GetSrc1()->IsRegOpnd() &&
            instr->GetDst()->AsRegOpnd()->GetStackSym() == instr->GetSrc1()->AsRegOpnd()->GetStackSym())
        {
            this->InsertByteCodeUses(instr, true);
            instr->m_opcode = Js::OpCode::Nop;
        }
        break;

    case Js::OpCode::LdSlot:
    case Js::OpCode::LdSlotArr:
        if (instr->GetDst()->IsRegOpnd() && instr->GetSrc1()->IsRegOpnd() &&
            instr->GetDst()->AsRegOpnd()->GetStackSym() == instr->GetSrc1()->AsRegOpnd()->GetStackSym())
        {
            this->InsertByteCodeUses(instr, true);
            instr->m_opcode = Js::OpCode::Nop;
        }
        else
        {
            instr->m_opcode = Js::OpCode::Ld_A;
        }
        break;

    case Js::OpCode::StSlotChkUndecl:
        if (instr->GetSrc2()->IsRegOpnd())
        {
            // Src2 here should refer to the same location as the Dst operand, which we need to keep live
            // due to the implicit read for ChkUndecl.
            instr->m_opcode = Js::OpCode::StSlot;
            instr->FreeSrc2();
            return nullptr;
        }
        break;

    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdRootFldForTypeOf:
    case Js::OpCode::LdFldForCallApplyTarget:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
    case Js::OpCode::ScopedLdFld:
    case Js::OpCode::ScopedLdFldForTypeOf:
        instr->m_opcode = Js::OpCode::Ld_A;
        break;

    case Js::OpCode::LdMethodFromFlags:
        // The bailout is checked on the loop top and we don't need to check bailout again in loop.
        instr->m_opcode = Js::OpCode::Ld_A;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::TypeofElem:
        instr->m_opcode = Js::OpCode::Typeof;
        break;
    }
    CurrentBlockData()->MarkTempLastUse(instr, regOpnd);

    return regOpnd;
}